

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  xml_node_struct *p;
  bool bVar3;
  size_t count;
  size_t sVar4;
  char_t *pcVar5;
  char_t *rhs;
  xml_node *this_00;
  xml_node_struct **ppxVar6;
  char_t *pcVar7;
  char_t *path__00;
  xml_node subsearch;
  xml_node local_48;
  xml_node local_40;
  xml_node local_38;
  
  if (*path_ == delimiter) {
    local_40 = root(this);
  }
  else {
    local_40 = (xml_node)this->_root;
  }
  if (local_40._root == (xml_node_struct *)0x0) {
LAB_0068bfe7:
    xml_node(&local_48);
  }
  else {
    rhs = path_ + -1;
    do {
      pcVar5 = rhs;
      cVar2 = pcVar5[1];
      rhs = pcVar5 + 1;
    } while (cVar2 == delimiter);
    sVar4 = 0;
    do {
      count = sVar4;
      sVar4 = count + 1;
      if (rhs[count] == '\0') break;
    } while (rhs[count] != delimiter);
    if (sVar4 == 1) {
      return (xml_node)local_40._root;
    }
    pcVar7 = rhs + (count - 1);
    do {
      path__00 = pcVar7 + 1;
      pcVar1 = pcVar7 + 1;
      pcVar7 = path__00;
    } while (*pcVar1 == delimiter);
    if (sVar4 == 2 && cVar2 == '.') {
      this_00 = &local_40;
    }
    else {
      if (((cVar2 != '.') || (sVar4 != 3)) || (pcVar5[2] != '.')) {
        ppxVar6 = &(local_40._root)->first_child;
        while (p = *ppxVar6, p != (xml_node_struct *)0x0) {
          if ((p->name != (char_t *)0x0) &&
             (bVar3 = impl::anon_unknown_0::strequalrange(p->name,rhs,count), bVar3)) {
            xml_node(&local_38,p);
            local_48 = first_element_by_path(&local_38,path__00,delimiter);
            if (local_48._root != (xml_node_struct *)0x0) {
              return (xml_node)local_48._root;
            }
          }
          ppxVar6 = &p->next_sibling;
        }
        goto LAB_0068bfe7;
      }
      local_38 = parent(&local_40);
      this_00 = &local_38;
    }
    local_48 = first_element_by_path(this_00,path__00,delimiter);
  }
  return (xml_node)local_48._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node context = path_[0] == delimiter ? root() : *this;

		if (!context._root) return xml_node();

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return context;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return context.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return context.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = context._root->first_child; j; j = j->next_sibling)
			{
				const char_t* jname = j->name;
				if (jname && impl::strequalrange(jname, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}